

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# traceback.c
# Opt level: O0

parasail_traceback_t *
parasail_result_get_traceback_extra
          (parasail_result_t *result,char *seqA,int lena,char *seqB,int lenb,
          parasail_matrix_t *matrix,char match,char pos,char neg,int case_sensitive,
          char *alphabet_aliases)

{
  int iVar1;
  parasail_matrix_t *matrix_local;
  int lenb_local;
  char *seqB_local;
  int lena_local;
  char *seqA_local;
  parasail_result_t *result_local;
  
  iVar1 = parasail_result_is_trace(result);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s: assert(%s) failed\n","parasail_result_get_traceback_extra",
            "parasail_result_is_trace(result)");
    result_local = (parasail_result_t *)0x0;
  }
  else if (((result->flag & 0x800U) == 0) && ((result->flag & 0x400U) == 0)) {
    result_local = (parasail_result_t *)
                   parasail_result_get_traceback_8
                             (result,seqA,lena,seqB,lenb,matrix,match,pos,neg,case_sensitive,
                              alphabet_aliases);
  }
  else if ((result->flag & 0x100000U) == 0) {
    if ((result->flag & 0x200000U) == 0) {
      if ((result->flag & 0x400000U) == 0) {
        if ((result->flag & 0x800000U) == 0) {
          result_local = (parasail_result_t *)0x0;
        }
        else {
          result_local = (parasail_result_t *)
                         parasail_result_get_traceback_striped_64
                                   (result,seqA,lena,seqB,lenb,matrix,match,pos,neg,case_sensitive,
                                    alphabet_aliases);
        }
      }
      else {
        result_local = (parasail_result_t *)
                       parasail_result_get_traceback_striped_32
                                 (result,seqA,lena,seqB,lenb,matrix,match,pos,neg,case_sensitive,
                                  alphabet_aliases);
      }
    }
    else {
      result_local = (parasail_result_t *)
                     parasail_result_get_traceback_striped_16
                               (result,seqA,lena,seqB,lenb,matrix,match,pos,neg,case_sensitive,
                                alphabet_aliases);
    }
  }
  else {
    result_local = (parasail_result_t *)
                   parasail_result_get_traceback_striped_8
                             (result,seqA,lena,seqB,lenb,matrix,match,pos,neg,case_sensitive,
                              alphabet_aliases);
  }
  return (parasail_traceback_t *)result_local;
}

Assistant:

parasail_traceback_t* parasail_result_get_traceback_extra(
        parasail_result_t *result,
        const char *seqA,
        int lena,
        const char *seqB,
        int lenb,
        const parasail_matrix_t *matrix,
        char match, char pos, char neg,
        int case_sensitive,
        const char *alphabet_aliases)
{
    PARASAIL_ASSERT(parasail_result_is_trace(result));

    if (result->flag & PARASAIL_FLAG_STRIPED
            || result->flag & PARASAIL_FLAG_SCAN) {
        if (result->flag & PARASAIL_FLAG_BITS_8) {
            return parasail_result_get_traceback_striped_8(
                    result, seqA, lena, seqB, lenb,
                    matrix, match, pos, neg,
                    case_sensitive, alphabet_aliases);
        }
        else if (result->flag & PARASAIL_FLAG_BITS_16) {
            return parasail_result_get_traceback_striped_16(
                    result, seqA, lena, seqB, lenb,
                    matrix, match, pos, neg,
                    case_sensitive, alphabet_aliases);
        }
        else if (result->flag & PARASAIL_FLAG_BITS_32) {
            return parasail_result_get_traceback_striped_32(
                    result, seqA, lena, seqB, lenb,
                    matrix, match, pos, neg,
                    case_sensitive, alphabet_aliases);
        }
        else if (result->flag & PARASAIL_FLAG_BITS_64) {
            return parasail_result_get_traceback_striped_64(
                    result, seqA, lena, seqB, lenb,
                    matrix, match, pos, neg,
                    case_sensitive, alphabet_aliases);
        }
    }
    else {
        return parasail_result_get_traceback_8(
                result, seqA, lena, seqB, lenb,
                matrix, match, pos, neg,
                case_sensitive, alphabet_aliases);
    }

    return NULL; /* unreachable */
}